

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int overflow;
  uchar buf [32];
  secp256k1_ge r;
  secp256k1_fe rx;
  secp256k1_gej pkj;
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar e;
  secp256k1_scalar s;
  secp256k1_scalar *in_stack_00000618;
  secp256k1_scalar *in_stack_00000620;
  secp256k1_gej *in_stack_00000628;
  secp256k1_gej *in_stack_00000630;
  secp256k1_ge *in_stack_fffffffffffffd28;
  undefined2 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd32;
  bool bVar2;
  undefined1 in_stack_fffffffffffffd33;
  undefined1 uVar3;
  int in_stack_fffffffffffffd34;
  secp256k1_scalar *in_stack_fffffffffffffd38;
  secp256k1_scalar *in_stack_fffffffffffffd40;
  secp256k1_fe *in_stack_fffffffffffffd58;
  secp256k1_fe *in_stack_fffffffffffffd60;
  secp256k1_gej *in_stack_fffffffffffffd88;
  secp256k1_ge *in_stack_fffffffffffffd90;
  uchar *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  uchar *in_stack_fffffffffffffdc0;
  uchar *in_stack_fffffffffffffdc8;
  secp256k1_scalar *in_stack_fffffffffffffdd0;
  uint local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/main_impl.h"
            ,0xe6,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)
               CONCAT44(in_stack_fffffffffffffd34,
                        CONCAT13(in_stack_fffffffffffffd33,
                                 CONCAT12(in_stack_fffffffffffffd32,in_stack_fffffffffffffd30))),
               (char *)in_stack_fffffffffffffd28);
    local_4 = 0;
  }
  else {
    uVar3 = in_RDX != 0 || in_RCX == 0;
    if (in_RDX != 0 || in_RCX == 0) {
      if (in_R8 == 0) {
        secp256k1_callback_call
                  ((secp256k1_callback *)
                   CONCAT44(in_stack_fffffffffffffd34,
                            CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd32,
                                                    in_stack_fffffffffffffd30))),
                   (char *)in_stack_fffffffffffffd28);
        local_4 = 0;
      }
      else {
        iVar1 = secp256k1_fe_set_b32_limit(&in_stack_fffffffffffffd28->x,(uchar *)0x10925a);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          secp256k1_scalar_set_b32
                    (in_stack_fffffffffffffd40,(uchar *)in_stack_fffffffffffffd38,
                     (int *)CONCAT44(in_stack_fffffffffffffd34,
                                     CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd32,
                                                             in_stack_fffffffffffffd30))));
          if (in_stack_fffffffffffffd34 == 0) {
            iVar1 = secp256k1_xonly_pubkey_load
                              ((secp256k1_context *)
                               (ulong)CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd32,
                                                              in_stack_fffffffffffffd30)),
                               in_stack_fffffffffffffd28,(secp256k1_xonly_pubkey *)0x1092c1);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              secp256k1_fe_get_b32
                        ((uchar *)CONCAT44(in_stack_fffffffffffffd34,
                                           CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd32,
                                                                   in_stack_fffffffffffffd30))),
                         &in_stack_fffffffffffffd28->x);
              secp256k1_schnorrsig_challenge
                        (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                         in_stack_fffffffffffffdb0);
              secp256k1_scalar_negate(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
              secp256k1_gej_set_ge
                        ((secp256k1_gej *)
                         CONCAT44(in_stack_fffffffffffffd34,
                                  CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd32,
                                                          in_stack_fffffffffffffd30))),
                         in_stack_fffffffffffffd28);
              secp256k1_ecmult(in_stack_00000630,in_stack_00000628,in_stack_00000620,
                               in_stack_00000618);
              secp256k1_ge_set_gej_var(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
              iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x109378);
              if (iVar1 == 0) {
                secp256k1_fe_normalize_var((secp256k1_fe *)0x109398);
                iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x1093a6);
                bVar2 = false;
                if (iVar1 == 0) {
                  iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
                  bVar2 = iVar1 != 0;
                }
                local_4 = (uint)bVar2;
              }
              else {
                local_4 = 0;
              }
            }
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
    else {
      secp256k1_callback_call
                ((secp256k1_callback *)
                 CONCAT44(in_stack_fffffffffffffd34,
                          CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd32,
                                                  in_stack_fffffffffffffd30))),
                 (char *)in_stack_fffffffffffffd28);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal(&rx, &r.x);
}